

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O2

void __thiscall Imath_2_5::Euler<float>::angleMapping(Euler<float> *this,int *i,int *j,int *k)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  int m [3];
  
  bVar1 = this->field_0xc;
  bVar2 = bVar1 >> 3 & 3;
  m[bVar2] = 0;
  bVar5 = (bVar1 & 4) == 0;
  cVar4 = '\x01';
  if (1 < bVar2) {
    cVar4 = -2;
  }
  m[(byte)(cVar4 + bVar2)] = bVar5 + 1;
  uVar3 = (uint)(byte)(bVar2 - 1);
  if (bVar2 == 0) {
    uVar3 = 2;
  }
  m[uVar3] = 2 - (uint)bVar5;
  *i = m[0];
  *j = m[1];
  *k = m[2];
  return;
}

Assistant:

inline void
 Euler<T>::angleMapping(int &i, int &j, int &k) const
{
    int m[3];

    m[_initialAxis] = 0;
    m[(_initialAxis+1) % 3] = _parityEven ? 1 : 2;
    m[(_initialAxis+2) % 3] = _parityEven ? 2 : 1;
    i = m[0];
    j = m[1];
    k = m[2];
}